

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float __thiscall
pbrt::PiecewiseConstant1D::Sample(PiecewiseConstant1D *this,Float u,Float *pdf,int *off)

{
  float fVar1;
  float *pfVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  size_t sVar7;
  float fVar8;
  Float FVar9;
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  float local_2c;
  anon_class_16_2_fd512de2 local_28;
  
  local_28.u = &local_2c;
  local_2c = u;
  local_28.this = this;
  sVar7 = FindInterval<pbrt::PiecewiseConstant1D::Sample(float,float*,int*)const::_lambda(int)_1_>
                    ((long)(int)(this->cdf).nStored,&local_28);
  iVar6 = (int)sVar7;
  if (off != (int *)0x0) {
    *off = iVar6;
  }
  pfVar2 = (this->cdf).ptr;
  fVar8 = pfVar2[iVar6];
  fVar1 = *(float *)((long)pfVar2 + ((long)((sVar7 << 0x20) + 0x100000000) >> 0x1e));
  if (pdf != (Float *)0x0) {
    FVar9 = 0.0;
    if (0.0 < this->funcInt) {
      FVar9 = (this->func).ptr[iVar6] / this->funcInt;
    }
    *pdf = FVar9;
  }
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar1),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar5._4_12_ = in_register_00001344;
  auVar5._0_4_ = in_XMM5_Da;
  auVar5 = vcvtusi2ss_avx512f(auVar5,(this->func).nStored);
  fVar8 = ((float)((uint)bVar4 * (int)((local_2c - fVar8) / (fVar1 - fVar8)) +
                  (uint)!bVar4 * (int)(local_2c - fVar8)) + (float)iVar6) / auVar5._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * this->max)),ZEXT416((uint)(1.0 - fVar8)),
                           ZEXT416((uint)this->min));
  return auVar5._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Sample(Float u, Float *pdf = nullptr, int *off = nullptr) const {
        // Find surrounding CDF segments and _offset_
        int offset =
            FindInterval((int)cdf.size(), [&](int index) { return cdf[index] <= u; });
        if (off)
            *off = offset;

        // Compute offset along CDF segment
        Float du = u - cdf[offset];
        if (cdf[offset + 1] - cdf[offset] > 0)
            du /= cdf[offset + 1] - cdf[offset];
        DCHECK(!IsNaN(du));

        // Compute PDF for sampled offset
        if (pdf != nullptr)
            *pdf = (funcInt > 0) ? func[offset] / funcInt : 0;

        // Return $x$ corresponding to sample
        return Lerp((offset + du) / size(), min, max);
    }